

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall
cmCTestMultiProcessHandler::FinishTestProcess
          (cmCTestMultiProcessHandler *this,
          unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *runner,bool started)

{
  _Rb_tree_header *p_Var1;
  cmCTestRunTest *this_00;
  cmCTestTestProperties *__x;
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  _Base_ptr p_Var6;
  mapped_type_conflict1 *pmVar7;
  mapped_type *ppcVar8;
  undefined7 in_register_00000011;
  undefined4 uVar9;
  size_t sVar10;
  pointer puVar11;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar12;
  int test;
  unsigned_long p;
  int local_54;
  unsigned_long local_50;
  undefined4 local_44;
  _Head_base<0UL,_cmCTestRunTest_*,_false> local_40;
  __uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *local_38;
  
  sVar10 = this->Completed + 1;
  this->Completed = sVar10;
  this_00 = (runner->_M_t).
            super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
            super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
            super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl;
  local_54 = this_00->Index;
  __x = this_00->TestProperties;
  uVar9 = (undefined4)CONCAT71(in_register_00000011,started);
  bVar3 = cmCTestRunTest::EndTest(this_00,sVar10,this->Total,started);
  if (((runner->_M_t).super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>.
       _M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
       super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl)->TimeoutIsForStopTime == true) {
    SetStopTimePassed(this);
  }
  if ((started) && (this->StopTimePassed == false)) {
    local_40._M_head_impl =
         (runner->_M_t).super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>.
         _M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
         super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl;
    (runner->_M_t).super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
    super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
    super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl = (cmCTestRunTest *)0x0;
    bVar4 = cmCTestRunTest::StartAgain
                      ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&local_40
                       ,this->Completed);
    std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr
              ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&local_40);
    if (bVar4) {
      this->Completed = this->Completed - 1;
      return;
    }
  }
  lVar5 = 0x168;
  local_44 = uVar9;
  local_38 = (__uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)runner;
  if ((bVar3) || (lVar5 = 0x170, __x->Disabled == false)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  **)((long)&this->_vptr_cmCTestMultiProcessHandler + lVar5),&__x->Name);
  }
  p_Var6 = (this->Tests).
           super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Tests).
            super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      pVar12 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
               equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                            *)&p_Var6[1]._M_parent,&local_54);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   &p_Var6[1]._M_parent,(_Base_ptr)pVar12.first._M_node,
                   (_Base_ptr)pVar12.second._M_node);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  pmVar7 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestFinishMap,&local_54);
  *pmVar7 = true;
  pmVar7 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestRunningMap,&local_54);
  *pmVar7 = false;
  WriteCheckpoint(this,local_54);
  DeallocateResources(this,local_54);
  UnlockResources(this,local_54);
  local_50 = CONCAT44(local_50._4_4_,local_54);
  ppcVar8 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type *)&local_50);
  sVar10 = (long)(*ppcVar8)->Processors;
  if (this->ParallelLevel < (ulong)(long)(*ppcVar8)->Processors) {
    sVar10 = this->ParallelLevel;
  }
  if (((this->HaveAffinity != 0) && (this->HaveAffinity < sVar10)) &&
     (ppcVar8 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&(this->Properties).
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type *)&local_50), (*ppcVar8)->WantAffinity != false)) {
    sVar10 = this->HaveAffinity;
  }
  this->RunningCount = this->RunningCount - sVar10;
  puVar11 = (__x->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)((long)&__x->Affinity + 8);
  if (puVar11 != puVar2) {
    do {
      local_50 = *puVar11;
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&this->ProcessorsAvailable,&local_50);
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar2);
    puVar11 = (__x->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)((long)&__x->Affinity + 8) != puVar11) {
      *(pointer *)((long)&__x->Affinity + 8) = puVar11;
    }
  }
  std::__uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::reset
            (local_38,(pointer)0x0);
  if ((char)local_44 != '\0') {
    StartNextTests(this);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::FinishTestProcess(
  std::unique_ptr<cmCTestRunTest> runner, bool started)
{
  this->Completed++;

  int test = runner->GetIndex();
  auto* properties = runner->GetTestProperties();

  bool testResult = runner->EndTest(this->Completed, this->Total, started);
  if (runner->TimedOutForStopTime()) {
    this->SetStopTimePassed();
  }
  if (started) {
    if (!this->StopTimePassed &&
        cmCTestRunTest::StartAgain(std::move(runner), this->Completed)) {
      this->Completed--; // remove the completed test because run again
      return;
    }
  }

  if (testResult) {
    this->Passed->push_back(properties->Name);
  } else if (!properties->Disabled) {
    this->Failed->push_back(properties->Name);
  }

  for (auto& t : this->Tests) {
    t.second.erase(test);
  }

  this->TestFinishMap[test] = true;
  this->TestRunningMap[test] = false;
  this->WriteCheckpoint(test);
  this->DeallocateResources(test);
  this->UnlockResources(test);
  this->RunningCount -= this->GetProcessorsUsed(test);

  for (auto p : properties->Affinity) {
    this->ProcessorsAvailable.insert(p);
  }
  properties->Affinity.clear();

  runner.reset();
  if (started) {
    this->StartNextTests();
  }
}